

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O3

REF_STATUS ref_validation_cell_node(REF_GRID ref_grid)

{
  int iVar1;
  int iVar2;
  REF_NODE pRVar3;
  REF_CELL ref_cell;
  REF_STATUS RVar4;
  long lVar5;
  ulong uVar6;
  REF_INT cell;
  long lVar7;
  uint uVar8;
  bool bVar9;
  REF_INT nodes [27];
  uint local_a8 [30];
  
  pRVar3 = ref_grid->node;
  uVar6 = 0;
  do {
    ref_cell = ref_grid->cell[uVar6];
    if (0 < ref_cell->max) {
      cell = 0;
      do {
        RVar4 = ref_cell_nodes(ref_cell,cell,(REF_INT *)local_a8);
        if (RVar4 == 0) {
          lVar5 = (long)ref_cell->node_per;
          if (lVar5 < 1) {
LAB_001eb6e7:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,400,"ref_validation_cell_node",1,"cell with all ghost nodes");
            return 1;
          }
          if ((int)local_a8[0] < 0) {
LAB_001eb68f:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x18a,"ref_validation_cell_node",1,"cell with invalid node");
            printf("group %d node_per %d\n",uVar6 & 0xffffffff,(ulong)(uint)ref_cell->node_per);
            return 1;
          }
          bVar9 = false;
          lVar7 = 0;
          uVar8 = local_a8[0];
          do {
            if ((ref_grid->node->max <= (int)uVar8) || (ref_grid->node->global[uVar8] < 0))
            goto LAB_001eb68f;
            if (bVar9) {
              bVar9 = true;
              if (lVar7 + 1 == lVar5) break;
            }
            else {
              iVar1 = ref_grid->mpi->id;
              iVar2 = pRVar3->part[uVar8];
              bVar9 = iVar1 == iVar2;
              if (lVar7 + 1 == lVar5) {
                if (iVar1 != iVar2) goto LAB_001eb6e7;
                break;
              }
            }
            lVar7 = lVar7 + 1;
            uVar8 = local_a8[lVar7];
            if ((int)uVar8 < 0) goto LAB_001eb68f;
          } while( true );
        }
        cell = cell + 1;
      } while (cell < ref_cell->max);
    }
    uVar6 = uVar6 + 1;
    if (uVar6 == 0x10) {
      return 0;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_node(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT group;
  REF_INT cell, node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL has_local;

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      has_local = REF_FALSE;
      for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
        if (!ref_node_valid(ref_grid_node(ref_grid), nodes[node])) {
          RSB(REF_FAILURE, "cell with invalid node", {
            printf("group %d node_per %d\n", group,
                   ref_cell_node_per(ref_cell));
          });
        }
        has_local = has_local || (ref_mpi_rank(ref_grid_mpi(ref_grid)) ==
                                  ref_node_part(ref_node, nodes[node]));
      }
      if (!has_local) {
        RSS(REF_FAILURE, "cell with all ghost nodes");
      }
    }
  }

  return REF_SUCCESS;
}